

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

void __thiscall cashew::Value::free(Value *this,void *__ptr)

{
  _Hashtable<wasm::IString,_std::pair<const_wasm::IString,_cashew::Ref>,_std::allocator<std::pair<const_wasm::IString,_cashew::Ref>_>,_std::__detail::_Select1st,_std::equal_to<wasm::IString>,_std::hash<wasm::IString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  
  if (this->type == Object) {
    this_00 = (_Hashtable<wasm::IString,_std::pair<const_wasm::IString,_cashew::Ref>,_std::allocator<std::pair<const_wasm::IString,_cashew::Ref>_>,_std::__detail::_Select1st,_std::equal_to<wasm::IString>,_std::hash<wasm::IString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)(this->field_1).arr;
    if (this_00 !=
        (_Hashtable<wasm::IString,_std::pair<const_wasm::IString,_cashew::Ref>,_std::allocator<std::pair<const_wasm::IString,_cashew::Ref>_>,_std::__detail::_Select1st,_std::equal_to<wasm::IString>,_std::hash<wasm::IString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
         *)0x0) {
      std::
      _Hashtable<wasm::IString,_std::pair<const_wasm::IString,_cashew::Ref>,_std::allocator<std::pair<const_wasm::IString,_cashew::Ref>_>,_std::__detail::_Select1st,_std::equal_to<wasm::IString>,_std::hash<wasm::IString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(this_00);
      operator_delete(this_00,0x38);
    }
  }
  else if (this->type == Array) {
    (((this->field_1).arr)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).usedElements =
         0;
  }
  this->type = Null;
  (this->field_1).str.str._M_len = 0;
  return;
}

Assistant:

void free() {
    if (type == Array) {
      arr->clear();
    } else if (type == Object) {
      delete obj;
    }
    type = Null;
    num = 0;
  }